

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall SslTcpServerImpl::SetDHParameter(SslTcpServerImpl *this,char *szDhParamFileName)

{
  size_type sVar1;
  reference this_00;
  wchar_t *pOut;
  allocator<wchar_t> local_49;
  wstring local_48 [39];
  byte local_21;
  char *pcStack_20;
  bool bRet;
  char *szDhParamFileName_local;
  SslTcpServerImpl *this_local;
  
  pcStack_20 = szDhParamFileName;
  szDhParamFileName_local = (char *)this;
  sVar1 = std::
          vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
          ::size(&this->m_SslCtx);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = std::
              vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
              ::back(&this->m_SslCtx);
    local_21 = OpenSSLWrapper::SslServerContext::SetDhParamFile(this_00,pcStack_20);
    if (!(bool)local_21) {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                (local_48,L"DH File could not be loaded\r\n",&local_49);
      pOut = (wchar_t *)std::__cxx11::wstring::c_str();
      OutputDebugString(pOut);
      std::__cxx11::wstring::~wstring(local_48);
      std::allocator<wchar_t>::~allocator(&local_49);
      std::
      vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
      pop_back(&this->m_SslCtx);
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SslTcpServerImpl::SetDHParameter(const char* const szDhParamFileName)
{
    if (m_SslCtx.size() == 0)
        return false;
    const bool bRet = m_SslCtx.back().SetDhParamFile(szDhParamFileName);
    if (bRet == false)
    {
        OutputDebugString(wstring(L"DH File could not be loaded\r\n").c_str());
        m_SslCtx.pop_back();
    }
    return bRet;
}